

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O2

_InstInfo * inst_vex_mod_lookup(_CodeInfo *ci,_InstNode in,_InstInfo *ii,uint index)

{
  int iVar1;
  uint8_t *puVar2;
  _InstInfo *p_Var3;
  
  puVar2 = ci->code;
  ci->code = puVar2 + 1;
  iVar1 = ci->codeLen;
  ci->codeLen = iVar1 + -1;
  if (iVar1 < 1) {
    ii = (_InstInfo *)0x0;
  }
  else if (puVar2[1] < 0xc0) {
    p_Var3 = inst_get_info(in,index + 4);
    return p_Var3;
  }
  return ii;
}

Assistant:

static _InstInfo* inst_vex_mod_lookup(_CodeInfo* ci, _InstNode in, _InstInfo* ii, unsigned int index)
{
	/* Advance to read the MOD from ModRM byte. */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	if (*ci->code < INST_DIVIDED_MODRM) {
		/* MOD is not 11, therefore change the index to 8 - 12 range in the prefixed table. */
		index += 4;
		/* Make a second lookup for this special instruction. */
		return inst_get_info(in, index);
	}
	/* Return the original one, in case we didn't find a suited instruction. */
	return ii;
}